

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

QString * __thiscall
QTextHtmlExporter::toHtml(QString *__return_storage_ptr__,QTextHtmlExporter *this,ExportMode mode)

{
  ArrayOptions *pAVar1;
  QTextCharFormat *this_00;
  QArrayData *pQVar2;
  qreal qVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Data *pDVar7;
  QTextFrame *pQVar8;
  long lVar9;
  long lVar10;
  QChar QVar11;
  long in_FS_OFFSET;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QLatin1String QVar25;
  QLatin1String QVar26;
  QLatin1String QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QByteArrayView QVar34;
  QLatin1String QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QLatin1String QVar38;
  undefined1 local_78 [16];
  QTextFrame *local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  QTextFrame *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar38.m_data =
       "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0//EN\" \"http://www.w3.org/TR/REC-html40/strict.dtd\">\n<html><head><meta name=\"qrichtext\" content=\"1\" />"
  ;
  QVar38.m_size = 0x90;
  QString::operator=(&this->html,QVar38);
  iVar6 = QFragmentMapData<QTextFragmentData>::length
                    ((QFragmentMapData<QTextFragmentData> *)(*(long *)&this->doc->field_0x8 + 0x158)
                     ,0);
  lVar10 = (long)iVar6;
  pDVar7 = (this->html).d.d;
  if (((pDVar7 == (Data *)0x0) ||
      (1 < (__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>)) ||
     (lVar9 = (pDVar7->super_QArrayData).alloc,
     lVar9 - ((long)((long)(this->html).d.ptr -
                    ((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             1) <= lVar10)) {
    lVar9 = (this->html).d.size;
    if (lVar10 < lVar9) {
      lVar10 = lVar9;
    }
    QString::reallocData((longlong)this,(AllocationOption)lVar10);
    pDVar7 = (this->html).d.d;
    if (pDVar7 != (Data *)0x0) {
      lVar9 = (pDVar7->super_QArrayData).alloc;
      goto LAB_004c3e09;
    }
  }
  else {
LAB_004c3e09:
    if (lVar9 != 0) {
      pAVar1 = &(pDVar7->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  this->fragmentMarkers = mode == ExportFragment;
  QVar12.m_data = (char *)0x18;
  QVar12.m_size = (qsizetype)this;
  QString::append(QVar12);
  lVar10 = *(long *)&this->doc->field_0x8;
  pQVar2 = *(QArrayData **)(lVar10 + 0x2a8);
  lVar10 = *(long *)(lVar10 + 0x2b8);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar10 != 0) {
    QVar13.m_data = (char *)0x7;
    QVar13.m_size = (qsizetype)this;
    QString::append(QVar13);
    QString::append((QString *)this);
    QVar14.m_data = &DAT_00000008;
    QVar14.m_size = (qsizetype)this;
    QString::append(QVar14);
  }
  QVar15.m_data = (char *)0x18;
  QVar15.m_size = (qsizetype)this;
  QString::append(QVar15);
  QVar16.m_data = (char *)0x21;
  QVar16.m_size = (qsizetype)this;
  QString::append(QVar16);
  QVar17.m_data = (char *)0x25;
  QVar17.m_size = (qsizetype)this;
  QString::append(QVar17);
  QVar18.m_data = (char *)0x2b;
  QVar18.m_size = (qsizetype)this;
  QString::append(QVar18);
  QVar19.m_data = (char *)0x29;
  QVar19.m_size = (qsizetype)this;
  QString::append(QVar19);
  QVar20.m_data = &DAT_00000008;
  QVar20.m_size = (qsizetype)this;
  QString::append(QVar20);
  QVar21.m_data = &DAT_0000000c;
  QVar21.m_size = (qsizetype)this;
  QString::append(QVar21);
  this_00 = &this->defaultCharFormat;
  QVar11.ucs = (char16_t)this;
  if (mode != ExportEntireDocument) {
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_78);
    QTextFormat::operator=(&this_00->super_QTextFormat,(QTextFormat *)local_78);
    QTextFormat::~QTextFormat((QTextFormat *)local_78);
    goto LAB_004c3f72;
  }
  QVar23.m_data = &DAT_00000008;
  QVar23.m_size = (qsizetype)this;
  QString::append(QVar23);
  resolvedFontFamilies((QStringList *)local_78,this_00);
  emitFontFamily(this,(QStringList *)local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_78);
  bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2001);
  if (bVar4) {
    QVar24.m_data = (char *)0xb;
    QVar24.m_size = (qsizetype)this;
    QString::append(QVar24);
    qVar3 = QTextFormat::doubleProperty(&this_00->super_QTextFormat,0x2001);
    QString::number(qVar3,(char)local_78,0x67);
    QString::append((QString *)this);
    if ((QTextFormatPrivate *)local_78._0_8_ != (QTextFormatPrivate *)0x0) {
      LOCK();
      *(int *)local_78._0_8_ = *(int *)local_78._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_78._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
LAB_004c41f1:
    QVar26.m_data = (char *)0x3;
    QVar26.m_size = (qsizetype)this;
    QString::append(QVar26);
  }
  else {
    bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2009);
    if (bVar4) {
      QVar25.m_data = (char *)0xb;
      QVar25.m_size = (qsizetype)this;
      QString::append(QVar25);
      iVar6 = QTextFormat::intProperty(&this_00->super_QTextFormat,0x2009);
      QString::number((int)local_78,iVar6);
      QString::append((QString *)this);
      if ((QTextFormatPrivate *)local_78._0_8_ != (QTextFormatPrivate *)0x0) {
        LOCK();
        *(int *)local_78._0_8_ = *(int *)local_78._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_78._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      goto LAB_004c41f1;
    }
  }
  QVar27.m_data = (char *)0xd;
  QVar27.m_size = (qsizetype)this;
  QString::append(QVar27);
  bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2003);
  iVar6 = 400;
  if (bVar4) {
    iVar6 = QTextFormat::intProperty(&this_00->super_QTextFormat,0x2003);
  }
  QString::number((int)local_78,iVar6);
  QString::append((QString *)this);
  if ((QTextFormatPrivate *)local_78._0_8_ != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_78._0_8_ = *(int *)local_78._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_78._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  QString::append(QVar11);
  QVar28.m_data = &DAT_0000000c;
  QVar28.m_size = (qsizetype)this;
  QString::append(QVar28);
  QTextFormat::boolProperty(&this_00->super_QTextFormat,0x2004);
  QVar29.m_data = &DAT_00000006;
  QVar29.m_size = (qsizetype)this;
  QString::append(QVar29);
  QString::append(QVar11);
  iVar6 = QTextFormat::intProperty(&this_00->super_QTextFormat,0x1fe9);
  bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x1fe1);
  if (bVar4) {
    if (iVar6 == 0) {
      qVar3 = QTextFormat::doubleProperty(&this_00->super_QTextFormat,0x1fe1);
      if ((qVar3 == 0.0) && (!NAN(qVar3))) goto LAB_004c43b1;
    }
    QVar30.m_data = &DAT_00000010;
    QVar30.m_size = (qsizetype)this;
    QString::append(QVar30);
    qVar3 = QTextFormat::doubleProperty(&this_00->super_QTextFormat,0x1fe1);
    if (iVar6 == 0) {
      qVar3 = qVar3 / 100.0 + -1.0;
    }
    QString::number(qVar3,(char)local_78,0x67);
    QString::append((QString *)this);
    if ((QTextFormatPrivate *)local_78._0_8_ != (QTextFormatPrivate *)0x0) {
      LOCK();
      *(int *)local_78._0_8_ = *(int *)local_78._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_78._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    QVar31.m_data = (char *)0x3;
    QVar31.m_size = (qsizetype)this;
    QString::append(QVar31);
  }
LAB_004c43b1:
  bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x1fe2);
  if (bVar4) {
    qVar3 = QTextFormat::doubleProperty(&this_00->super_QTextFormat,0x1fe2);
    if ((qVar3 != 0.0) || (NAN(qVar3))) {
      QVar32.m_data = (char *)0xe;
      QVar32.m_size = (qsizetype)this;
      QString::append(QVar32);
      qVar3 = QTextFormat::doubleProperty(&this_00->super_QTextFormat,0x1fe2);
      QString::number(qVar3,(char)local_78,0x67);
      QString::append((QString *)this);
      if ((QTextFormatPrivate *)local_78._0_8_ != (QTextFormatPrivate *)0x0) {
        LOCK();
        *(int *)local_78._0_8_ = *(int *)local_78._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_78._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      QVar33.m_data = (char *)0x3;
      QVar33.m_size = (qsizetype)this;
      QString::append(QVar33);
    }
  }
  QVar34.m_data = (storage_type *)0x11;
  QVar34.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar34);
  local_48._0_8_ = local_78._0_8_;
  local_48._8_8_ = local_78._8_8_;
  local_38 = local_68;
  bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2005);
  if (((bVar4) || (bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2023), bVar4)) &&
     (bVar4 = QTextCharFormat::fontUnderline(this_00), bVar4)) {
    QVar35.m_data = (char *)0xa;
    QVar35.m_size = (qsizetype)local_48;
    QString::append(QVar35);
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  bVar5 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2006);
  if ((bVar5) && (bVar5 = QTextFormat::boolProperty(&this_00->super_QTextFormat,0x2006), bVar5)) {
    QVar36.m_data = (char *)0x9;
    QVar36.m_size = (qsizetype)local_48;
    QString::append(QVar36);
    bVar4 = true;
  }
  bVar5 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2007);
  if ((bVar5) && (bVar5 = QTextFormat::boolProperty(&this_00->super_QTextFormat,0x2007), bVar5)) {
    QVar37.m_data = (char *)0xd;
    QVar37.m_size = (qsizetype)local_48;
    QString::append(QVar37);
LAB_004c454a:
    local_78._0_8_ = local_48;
    local_78._8_2_ = 0x3b;
    ::operator+=(&this->html,(QStringBuilder<QString_&,_char16_t> *)local_78);
  }
  else if (bVar4) goto LAB_004c454a;
  QString::append(QVar11);
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocumentPrivate::rootFrame(*(QTextDocumentPrivate **)&this->doc->field_0x8);
  QTextFrame::frameFormat((QTextFrame *)local_78);
  emitBackgroundAttribute(this,(QTextFormat *)local_78);
  QTextFormat::~QTextFormat((QTextFormat *)local_78);
  if ((QTextFormatPrivate *)local_48._0_8_ != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_48._0_8_ = *(int *)local_48._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_48._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_48._0_8_,2,0x10);
    }
  }
LAB_004c3f72:
  QString::append(QVar11);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocumentPrivate::rootFrame(*(QTextDocumentPrivate **)&this->doc->field_0x8);
  QTextFrame::frameFormat((QTextFrame *)local_48);
  QTextFormat::clearProperty((QTextFormat *)local_48,0x820);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextFrameFormat::QTextFrameFormat((QTextFrameFormat *)local_58);
  QTextFrameFormat::setMargin
            ((QTextFrameFormat *)local_58,*(qreal *)(*(long *)&this->doc->field_0x8 + 0x310));
  bVar4 = QTextFormat::operator==((QTextFormat *)local_48,(QTextFormat *)local_58);
  if (bVar4) {
    pQVar8 = QTextDocumentPrivate::rootFrame(*(QTextDocumentPrivate **)&this->doc->field_0x8);
    QTextFrame::begin((iterator *)local_78,pQVar8);
    emitFrame(this,(iterator *)local_78);
  }
  else {
    pQVar8 = QTextDocumentPrivate::rootFrame(*(QTextDocumentPrivate **)&this->doc->field_0x8);
    emitTextFrame(this,pQVar8);
  }
  QVar22.m_data = (char *)0xe;
  QVar22.m_size = (qsizetype)this;
  QString::append(QVar22);
  pDVar7 = (this->html).d.d;
  (__return_storage_ptr__->d).d = pDVar7;
  (__return_storage_ptr__->d).ptr = (this->html).d.ptr;
  (__return_storage_ptr__->d).size = (this->html).d.size;
  if (pDVar7 != (Data *)0x0) {
    LOCK();
    (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextHtmlExporter::toHtml(ExportMode mode)
{
    html = "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0//EN\" "
           "\"http://www.w3.org/TR/REC-html40/strict.dtd\">\n"
           "<html><head><meta name=\"qrichtext\" content=\"1\" />"_L1;
    html.reserve(QTextDocumentPrivate::get(doc)->length());

    fragmentMarkers = (mode == ExportFragment);

    html += "<meta charset=\"utf-8\" />"_L1;

    QString title  = doc->metaInformation(QTextDocument::DocumentTitle);
    if (!title.isEmpty()) {
        html += "<title>"_L1;
        html += title;
        html += "</title>"_L1;
    }
    html += "<style type=\"text/css\">\n"_L1;
    html += "p, li { white-space: pre-wrap; }\n"_L1;
    html += "hr { height: 1px; border-width: 0; }\n"_L1;
    html += "li.unchecked::marker { content: \"\\2610\"; }\n"_L1;
    html += "li.checked::marker { content: \"\\2612\"; }\n"_L1;
    html += "</style>"_L1;
    html += "</head><body"_L1;

    if (mode == ExportEntireDocument) {
        html += " style=\""_L1;

        emitFontFamily(resolvedFontFamilies(defaultCharFormat));

        if (defaultCharFormat.hasProperty(QTextFormat::FontPointSize)) {
            html += " font-size:"_L1;
            html += QString::number(defaultCharFormat.fontPointSize());
            html += "pt;"_L1;
        } else if (defaultCharFormat.hasProperty(QTextFormat::FontPixelSize)) {
            html += " font-size:"_L1;
            html += QString::number(defaultCharFormat.intProperty(QTextFormat::FontPixelSize));
            html += "px;"_L1;
        }

        html += " font-weight:"_L1;
        html += QString::number(defaultCharFormat.fontWeight());
        html += u';';

        html += " font-style:"_L1;
        html += (defaultCharFormat.fontItalic() ? "italic"_L1 : "normal"_L1);
        html += u';';

        const bool percentSpacing = (defaultCharFormat.fontLetterSpacingType() == QFont::PercentageSpacing);
        if (defaultCharFormat.hasProperty(QTextFormat::FontLetterSpacing) &&
            (!percentSpacing || defaultCharFormat.fontLetterSpacing() != 0.0)) {
            html += " letter-spacing:"_L1;
            qreal value = defaultCharFormat.fontLetterSpacing();
            if (percentSpacing) // Map to em (100% == 0em)
                value = (value / 100) - 1;
            html += QString::number(value);
            html += percentSpacing ? "em;"_L1 : "px;"_L1;
        }

        if (defaultCharFormat.hasProperty(QTextFormat::FontWordSpacing) &&
            defaultCharFormat.fontWordSpacing() != 0.0) {
            html += " word-spacing:"_L1;
            html += QString::number(defaultCharFormat.fontWordSpacing());
            html += "px;"_L1;
        }

        QString decorationTag(" text-decoration:"_L1);
        bool atLeastOneDecorationSet = false;
        if (defaultCharFormat.hasProperty(QTextFormat::FontUnderline) || defaultCharFormat.hasProperty(QTextFormat::TextUnderlineStyle)) {
            if (defaultCharFormat.fontUnderline()) {
                decorationTag += " underline"_L1;
                atLeastOneDecorationSet = true;
            }
        }
        if (defaultCharFormat.hasProperty(QTextFormat::FontOverline)) {
            if (defaultCharFormat.fontOverline()) {
                decorationTag += " overline"_L1;
                atLeastOneDecorationSet = true;
            }
        }
        if (defaultCharFormat.hasProperty(QTextFormat::FontStrikeOut)) {
            if (defaultCharFormat.fontStrikeOut()) {
                decorationTag += " line-through"_L1;
                atLeastOneDecorationSet = true;
            }
        }
        if (atLeastOneDecorationSet)
            html += decorationTag + u';';

        html += u'\"';

        const QTextFrameFormat fmt = doc->rootFrame()->frameFormat();
        emitBackgroundAttribute(fmt);

    } else {
        defaultCharFormat = QTextCharFormat();
    }
    html += u'>';

    QTextFrameFormat rootFmt = doc->rootFrame()->frameFormat();
    rootFmt.clearProperty(QTextFormat::BackgroundBrush);

    QTextFrameFormat defaultFmt;
    defaultFmt.setMargin(doc->documentMargin());

    if (rootFmt == defaultFmt)
        emitFrame(doc->rootFrame()->begin());
    else
        emitTextFrame(doc->rootFrame());

    html += "</body></html>"_L1;
    return html;
}